

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall UdpSocketImpl::SelectThread(UdpSocketImpl *this)

{
  atomic_uchar *paVar1;
  int iVar2;
  int iVar3;
  uchar *__s;
  int *piVar4;
  ssize_t sVar5;
  char *pcVar6;
  size_t sVar7;
  uchar *__s_00;
  BaseSocket *pBVar8;
  ulong uVar9;
  long lVar10;
  unsigned_long uVar11;
  bool bVar12;
  bool bReadCall;
  int32_t transferred;
  socklen_t iLen;
  socklen_t sinLen;
  string caAddrBuf;
  anon_union_28_2_13231a05 SenderAddr;
  mutex mxNotify;
  stringstream strAbsender;
  char local_399;
  _Head_base<0UL,_unsigned_char_*,_false> local_398;
  int local_38c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  socklen_t local_364;
  long *local_360 [2];
  long local_350 [2];
  int *local_340;
  pthread_mutex_t *local_338;
  deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
  *local_330;
  _Any_data *local_328;
  unsigned_long local_320;
  sockaddr local_314;
  timeval local_2f8;
  pthread_mutex_t local_2e8;
  fd_set local_2b8;
  fd_set local_238;
  timespec local_1b8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_399 = '\0';
  local_2e8._16_8_ = 0;
  local_2e8.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_2e8.__align = 0;
  local_2e8._8_8_ = 0;
  local_2e8.__data.__list.__next = (__pthread_internal_list *)0x0;
  __s = (uchar *)operator_new__(0xffff);
  memset(__s,0,0xffff);
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    local_328 = (_Any_data *)&this->m_fnSslDecode;
    local_338 = (pthread_mutex_t *)&this->m_mxInDeque;
    local_330 = (deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                 *)&this->m_quInData;
    local_340 = &(this->super_BaseSocketImpl).m_iError;
    do {
      if ((this->m_atInBytes).super___atomic_base<unsigned_long>._M_i < 0x40001) {
        local_2f8.tv_sec = 2;
        local_2f8.tv_usec = 0;
        local_238.fds_bits[0xe] = 0;
        local_238.fds_bits[0xf] = 0;
        local_238.fds_bits[0xc] = 0;
        local_238.fds_bits[0xd] = 0;
        local_238.fds_bits[10] = 0;
        local_238.fds_bits[0xb] = 0;
        local_238.fds_bits[8] = 0;
        local_238.fds_bits[9] = 0;
        local_238.fds_bits[6] = 0;
        local_238.fds_bits[7] = 0;
        local_238.fds_bits[4] = 0;
        local_238.fds_bits[5] = 0;
        local_238.fds_bits[2] = 0;
        local_238.fds_bits[3] = 0;
        local_238.fds_bits[0] = 0;
        local_238.fds_bits[1] = 0;
        local_2b8.fds_bits[0] = 0;
        local_2b8.fds_bits[1] = 0;
        local_2b8.fds_bits[2] = 0;
        local_2b8.fds_bits[3] = 0;
        local_2b8.fds_bits[4] = 0;
        local_2b8.fds_bits[5] = 0;
        local_2b8.fds_bits[6] = 0;
        local_2b8.fds_bits[7] = 0;
        local_2b8.fds_bits[8] = 0;
        local_2b8.fds_bits[9] = 0;
        local_2b8.fds_bits[10] = 0;
        local_2b8.fds_bits[0xb] = 0;
        local_2b8.fds_bits[0xc] = 0;
        local_2b8.fds_bits[0xd] = 0;
        local_2b8.fds_bits[0xe] = 0;
        local_2b8.fds_bits[0xf] = 0;
        iVar2 = (this->super_BaseSocketImpl).m_fSock;
        iVar3 = iVar2 + 0x3f;
        if (-1 < iVar2) {
          iVar3 = iVar2;
        }
        uVar9 = 1L << ((byte)iVar2 & 0x3f);
        local_238.fds_bits[iVar3 >> 6] = local_238.fds_bits[iVar3 >> 6] | uVar9;
        local_2b8.fds_bits[iVar3 >> 6] = local_2b8.fds_bits[iVar3 >> 6] | uVar9;
        iVar2 = select(iVar2 + 1,&local_238,(fd_set *)0x0,&local_2b8,&local_2f8);
        if (0 < iVar2) {
          iVar2 = (this->super_BaseSocketImpl).m_fSock;
          iVar3 = iVar2 + 0x3f;
          if (-1 < iVar2) {
            iVar3 = iVar2;
          }
          if (((ulong)local_2b8.fds_bits[iVar3 >> 6] >> ((ulong)(uint)(iVar2 % 0x40) & 0x3f) & 1) !=
              0) {
            local_388._M_dataplus._M_p._0_4_ = 4;
            getsockopt(iVar2,1,4,local_340,(socklen_t *)&local_388);
            (this->super_BaseSocketImpl).m_iErrLoc = 7;
            bVar12 = (this->super_BaseSocketImpl).m_bStop;
            if (bVar12 == false &&
                (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
                (_Manager_type)0x0) {
              local_360[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
              local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
              (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                        ((_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam,
                         (BaseSocket **)&local_1b8,local_360);
            }
            else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                     (_Manager_type)0x0 && bVar12 == false) {
              local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
              (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                        ((_Any_data *)&(this->super_BaseSocketImpl).m_fError,
                         (BaseSocket **)&local_1b8);
            }
            break;
          }
          if ((local_238.fds_bits[iVar3 >> 6] & 1L << ((byte)(iVar2 % 0x40) & 0x3f)) != 0) {
            local_364 = 0x1c;
            sVar5 = recvfrom(iVar2,__s,0xffff,0,&local_314,&local_364);
            local_38c = (int)sVar5;
            if (local_38c < 1) {
              if (local_38c == 0) {
                iVar2 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
                if (iVar2 != 0) {
                  piVar4 = __errno_location();
                  (this->super_BaseSocketImpl).m_iError = *piVar4;
                  (this->super_BaseSocketImpl).m_iErrLoc = 9;
                }
                if (local_399 == '\x01') {
                  do {
                    local_1b8.tv_sec = 0;
                    local_1b8.tv_nsec = 10000000;
                    do {
                      iVar2 = nanosleep(&local_1b8,&local_1b8);
                      if (iVar2 != -1) break;
                      piVar4 = __errno_location();
                    } while (*piVar4 == 4);
                  } while (local_399 != '\0');
                }
                pBVar8 = (this->super_BaseSocketImpl).m_pBkRef;
                if (pBVar8 != (BaseSocket *)0x0) {
                  pBVar8 = (BaseSocket *)
                           __dynamic_cast(pBVar8,&BaseSocket::typeinfo,&UdpSocket::typeinfo,0);
                  if (pBVar8 == (BaseSocket *)0x0 ||
                      (this->m_fBytesReceivedParam).super__Function_base._M_manager ==
                      (_Manager_type)0x0) {
                    if ((this->m_fBytesReceived).super__Function_base._M_manager !=
                        (_Manager_type)0x0 && pBVar8 != (BaseSocket *)0x0) {
                      local_1b8.tv_sec = (__time_t)pBVar8;
                      (*(this->m_fBytesReceived)._M_invoker)
                                ((_Any_data *)&this->m_fBytesReceived,(UdpSocket **)&local_1b8);
                    }
                  }
                  else {
                    local_360[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
                    local_1b8.tv_sec = (__time_t)pBVar8;
                    (*(this->m_fBytesReceivedParam)._M_invoker)
                              ((_Any_data *)&this->m_fBytesReceivedParam,(UdpSocket **)&local_1b8,
                               local_360);
                  }
                }
                goto LAB_0011c0e1;
              }
              piVar4 = __errno_location();
              iVar2 = *piVar4;
              *local_340 = iVar2;
              if (iVar2 != 0xb) {
                (this->super_BaseSocketImpl).m_iErrLoc = 0xb;
                bVar12 = (this->super_BaseSocketImpl).m_bStop;
                if (bVar12 == false &&
                    (this->super_BaseSocketImpl).m_fErrorParam.super__Function_base._M_manager !=
                    (_Manager_type)0x0) {
                  local_360[0] = (long *)(this->super_BaseSocketImpl).m_pvUserData;
                  local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
                  (*(this->super_BaseSocketImpl).m_fErrorParam._M_invoker)
                            ((_Any_data *)&(this->super_BaseSocketImpl).m_fErrorParam,
                             (BaseSocket **)&local_1b8,local_360);
                }
                else if ((this->super_BaseSocketImpl).m_fError.super__Function_base._M_manager !=
                         (_Manager_type)0x0 && bVar12 == false) {
                  local_1b8.tv_sec = (__time_t)(this->super_BaseSocketImpl).m_pBkRef;
                  (*(this->super_BaseSocketImpl).m_fError._M_invoker)
                            ((_Any_data *)&(this->super_BaseSocketImpl).m_fError,
                             (BaseSocket **)&local_1b8);
                }
                break;
              }
            }
            else {
              std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
              local_360[0] = local_350;
              std::__cxx11::string::_M_construct((ulong)local_360,'/');
              iVar2 = (int)(ostream *)local_1a8;
              if (local_314.sa_family == 10) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[",1);
                pcVar6 = inet_ntop((uint)local_314.sa_family,local_314.sa_data + 6,
                                   (char *)local_360[0],0x20);
                if (pcVar6 == (char *)0x0) {
                  lVar10 = 2;
                  std::ios::clear(iVar2 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
                  pcVar6 = "]:";
                }
                else {
                  sVar7 = strlen(pcVar6);
                  lVar10 = 2;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar6,sVar7);
                  pcVar6 = "]:";
                }
              }
              else {
                pcVar6 = inet_ntop((uint)local_314.sa_family,local_314.sa_data + 2,
                                   (char *)local_360[0],0x20);
                if (pcVar6 == (char *)0x0) {
                  lVar10 = 1;
                  std::ios::clear(iVar2 + (int)*(undefined8 *)(local_1a8[0] + -0x18));
                  pcVar6 = ":";
                }
                else {
                  sVar7 = strlen(pcVar6);
                  lVar10 = 1;
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,pcVar6,sVar7);
                  pcVar6 = ":";
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,lVar10)
              ;
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              if ((this->m_fnSslDecode).super__Function_base._M_manager == (_Manager_type)0x0) {
                bVar12 = true;
LAB_0011bf03:
                iVar2 = local_38c;
                uVar9 = (ulong)local_38c;
                __s_00 = (uchar *)operator_new__(uVar9);
                memset(__s_00,0,uVar9);
                local_398._M_head_impl = __s_00;
                if (0 < iVar2) {
                  memcpy(__s_00,__s,uVar9);
                }
                iVar2 = pthread_mutex_lock(local_338);
                if (iVar2 != 0) {
                  std::__throw_system_error(iVar2);
                }
                std::__cxx11::stringbuf::str();
                std::
                deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                ::
                emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&,std::__cxx11::string>
                          (local_330,
                           (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                           &local_398,&local_38c,&local_388);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
                  operator_delete(local_388._M_dataplus._M_p,
                                  local_388.field_2._M_allocated_capacity + 1);
                }
                LOCK();
                (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
                     (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i + (long)local_38c;
                UNLOCK();
                pthread_mutex_unlock(local_338);
                if (local_398._M_head_impl != (uchar *)0x0) {
                  operator_delete__(local_398._M_head_impl);
                }
              }
              else {
                uVar11 = (unsigned_long)local_38c;
                std::__cxx11::stringbuf::str();
                local_398._M_head_impl = __s;
                local_320 = uVar11;
                if ((this->m_fnSslDecode).super__Function_base._M_manager == (_Manager_type)0x0) {
                  std::__throw_bad_function_call();
                }
                iVar2 = (*(this->m_fnSslDecode)._M_invoker)
                                  (local_328,&local_398._M_head_impl,&local_320,&local_388);
                bVar12 = iVar2 != -1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_388._M_dataplus._M_p != &local_388.field_2) {
                  operator_delete(local_388._M_dataplus._M_p,
                                  local_388.field_2._M_allocated_capacity + 1);
                }
                if (iVar2 == 0) goto LAB_0011bf03;
              }
              if (((this->m_fBytesReceivedParam).super__Function_base._M_manager !=
                   (_Manager_type)0x0 ||
                   (this->m_fBytesReceived).super__Function_base._M_manager != (_Manager_type)0x0)
                 && (bVar12 && (this->super_BaseSocketImpl).m_bStop == false)) {
                iVar2 = pthread_mutex_lock(&local_2e8);
                if (iVar2 != 0) {
                  std::__throw_system_error(iVar2);
                }
                if (local_399 == '\0') {
                  local_399 = '\x01';
                  local_398._M_head_impl = (uchar *)0x0;
                  local_388._M_dataplus._M_p = (pointer)operator_new(0x20);
                  *(undefined ***)local_388._M_dataplus._M_p = &PTR___State_00146858;
                  *(pthread_mutex_t **)((long)local_388._M_dataplus._M_p + 8) = &local_2e8;
                  *(UdpSocketImpl **)((long)local_388._M_dataplus._M_p + 0x10) = this;
                  *(char **)((long)local_388._M_dataplus._M_p + 0x18) = &local_399;
                  std::thread::_M_start_thread(&local_398,&local_388,0);
                  if ((long *)local_388._M_dataplus._M_p != (long *)0x0) {
                    (**(code **)(*(long *)local_388._M_dataplus._M_p + 8))();
                  }
                  std::thread::detach();
                  if (local_398._M_head_impl != (uchar *)0x0) {
                    std::terminate();
                  }
                }
                pthread_mutex_unlock(&local_2e8);
              }
              if (local_360[0] != local_350) {
                operator_delete(local_360[0],local_350[0] + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
              std::ios_base::~ios_base(local_138);
            }
          }
        }
      }
      else {
        local_1b8.tv_sec = 0;
        local_1b8.tv_nsec = 1000000;
        do {
          iVar2 = nanosleep(&local_1b8,&local_1b8);
          if (iVar2 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
      }
    } while ((this->super_BaseSocketImpl).m_bStop == false);
  }
  if (((this->super_BaseSocketImpl).m_iError == 0) &&
     (iVar2 = shutdown((this->super_BaseSocketImpl).m_fSock,0), iVar2 != 0)) {
    piVar4 = __errno_location();
    (this->super_BaseSocketImpl).m_iError = *piVar4;
    (this->super_BaseSocketImpl).m_iErrLoc = 10;
  }
LAB_0011c0e1:
  if (local_399 == '\x01') {
    do {
      local_1b8.tv_sec = 0;
      local_1b8.tv_nsec = 10000000;
      do {
        iVar2 = nanosleep(&local_1b8,&local_1b8);
        if (iVar2 != -1) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    } while (local_399 != '\0');
  }
  iVar2 = pthread_mutex_lock(&local_2e8);
  if (iVar2 == 0) {
    pthread_mutex_unlock(&local_2e8);
    LOCK();
    paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
    (paVar1->super___atomic_base<unsigned_char>)._M_i =
         (paVar1->super___atomic_base<unsigned_char>)._M_i | 1;
    UNLOCK();
    paVar1 = &(this->super_BaseSocketImpl).m_iShutDownState;
    LOCK();
    bVar12 = (paVar1->super___atomic_base<unsigned_char>)._M_i == '\x03';
    if (bVar12) {
      (paVar1->super___atomic_base<unsigned_char>)._M_i = '\x0f';
    }
    UNLOCK();
    if (bVar12) {
      iVar2 = (this->super_BaseSocketImpl).m_fSock;
      if (iVar2 != -1) {
        close(iVar2);
      }
      (this->super_BaseSocketImpl).m_fSock = -1;
      if ((this->super_BaseSocketImpl).m_fClosingParam.super__Function_base._M_manager !=
          (_Manager_type)0x0 ||
          (this->super_BaseSocketImpl).m_fClosing.super__Function_base._M_manager !=
          (_Manager_type)0x0) {
        (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])(this);
      }
    }
    operator_delete__(__s);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void UdpSocketImpl::SelectThread()
{
    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x40000)  // More than 256 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 7;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                union
                {
                    sockaddr_in sin;
                    sockaddr_in6 sin6;
                }SenderAddr;
                socklen_t sinLen = sizeof(SenderAddr);

                int32_t transferred = ::recvfrom(m_fSock, &buf[0], 0x0000ffff, 0, reinterpret_cast<sockaddr*>(&SenderAddr), &sinLen);

                if (transferred <= 0)
                {
                    if (transferred == 0)
                    {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                        // We set the flag, so we don't read on the connection any more
                        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                        {
                            m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                            m_iErrLoc = 9;
                        }
                        bSocketShutDown = true;

                        while (bReadCall == true)
                            this_thread::sleep_for(chrono::milliseconds(10));

                        UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                        if (m_fBytesReceivedParam && pUdpSocket != nullptr)
                            m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                        else if (m_fBytesReceived && pUdpSocket != nullptr)
                            m_fBytesReceived(pUdpSocket);
                        break;
                    }
                    else
                    {
                        m_iError = WSAGetLastError();
                        if (m_iError != WSAEWOULDBLOCK)
                        {
                            m_iErrLoc = 11;
                            if (m_fErrorParam && m_bStop == false)
                                m_fErrorParam(m_pBkRef, m_pvUserData);
                            else if (m_fError && m_bStop == false)
                                m_fError(m_pBkRef);
                            break;
                        }
                    }
                }
                else
                {
                    stringstream strAbsender;
                    string caAddrBuf(INET6_ADDRSTRLEN + 1, 0);
                    if (SenderAddr.sin6.sin6_family == AF_INET6)
                    {
                        strAbsender << "[" << inet_ntop(SenderAddr.sin6.sin6_family, &SenderAddr.sin6.sin6_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << "]:" << ntohs(SenderAddr.sin6.sin6_port);
                    }
                    else
                    {
                        strAbsender << inet_ntop(SenderAddr.sin.sin_family, &SenderAddr.sin.sin_addr, &caAddrBuf[0], sizeof(caAddrBuf));
                        strAbsender << ":" << ntohs(SenderAddr.sin.sin_port);
                    }

                    int iRet = 0;
                    if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<uint8_t*>(&buf[0]), transferred, strAbsender.str()), iRet == 0))
                    {
                        auto tmp = make_unique<uint8_t[]>(transferred);
                        copy_n(&buf[0], transferred, &tmp[0]);
                        m_mxInDeque.lock();
                        m_quInData.emplace_back(move(tmp), transferred, strAbsender.str());
                        m_atInBytes += transferred;
                        m_mxInDeque.unlock();
                    }

                    if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                    {
                        lock_guard<mutex> lock(mxNotify);
                        if (bReadCall == false)
                        {
                            bReadCall = true;
                            thread([&]()
                            {
                                mxNotify.lock();
                                while (m_atInBytes > 0 && m_bStop == false)
                                {
                                    UdpSocket* pUdpSocket = dynamic_cast<UdpSocket*>(m_pBkRef);
                                    mxNotify.unlock();
                                    if (m_fBytesReceivedParam != nullptr && pUdpSocket != nullptr)
                                        m_fBytesReceivedParam(pUdpSocket, m_pvUserData);
                                    else if (pUdpSocket != nullptr)
                                        m_fBytesReceived(pUdpSocket);
                                    mxNotify.lock();
                                }
                                bReadCall = false;
                                mxNotify.unlock();
                            }).detach();
                        }
                    }
                }
            }
        }
    }

    if (bSocketShutDown == false && m_iError == 0)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 10;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // In rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 3;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
            ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;

        if (m_fClosing || m_fClosingParam)
            StartClosingCB();
    }
}